

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_registry.c
# Opt level: O2

upb_MiniTableExtension *
upb_ExtensionRegistry_Lookup(upb_ExtensionRegistry *r,upb_MiniTable *t,uint32_t num)

{
  _Bool _Var1;
  upb_value v;
  char buf [12];
  
  buf._0_8_ = t;
  buf._8_4_ = num;
  _Var1 = upb_strtable_lookup2(&r->exts,buf,0xc,&v);
  if (!_Var1) {
    v.val = 0;
  }
  return (upb_MiniTableExtension *)v.val;
}

Assistant:

const upb_MiniTableExtension* upb_ExtensionRegistry_Lookup(
    const upb_ExtensionRegistry* r, const upb_MiniTable* t, uint32_t num) {
  char buf[EXTREG_KEY_SIZE];
  upb_value v;
  extreg_key(buf, t, num);
  if (upb_strtable_lookup2(&r->exts, buf, EXTREG_KEY_SIZE, &v)) {
    return upb_value_getconstptr(v);
  } else {
    return NULL;
  }
}